

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_1::AllFeaturesGroup::init
          (AllFeaturesGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  RandomShaderCase *pRVar2;
  int seed;
  deUint32 seed_00;
  ProgramParameters local_98;
  
  local_98.vertexParameters.randomize = false;
  local_98.seed = 0;
  local_98.version = VERSION_100;
  local_98.vertexParameters.maxUniformScalars = 0x200;
  local_98.vertexParameters.maxInputVariables = 8;
  local_98.vertexParameters.texLookupBaseWeight = 0.0;
  local_98.vertexParameters.maxSamplers = 8;
  local_98.vertexParameters.useTexture2D = false;
  local_98.vertexParameters.useTextureCube = false;
  local_98.fragmentParameters.randomize = false;
  local_98.fragmentParameters.maxUniformScalars = 0x200;
  local_98.fragmentParameters.maxInputVariables = 8;
  local_98.fragmentParameters.texLookupBaseWeight = 4.0;
  local_98.fragmentParameters.maxSamplers = 8;
  local_98.declarationStatementBaseWeight = true;
  local_98.useScalarConversions = true;
  local_98.useSwizzle = true;
  local_98.useComparisonOps = true;
  local_98.useConditionals = true;
  local_98.trigonometricBaseWeight = 1.0;
  local_98.exponentialBaseWeight = 1.0;
  local_98.vertexParameters.maxStatementDepth = 4;
  local_98.vertexParameters.maxStatementsPerBlock = 7;
  local_98.vertexParameters.maxExpressionDepth = 7;
  local_98.vertexParameters.maxCombinedVariableScalars = 0x40;
  local_98.fragmentParameters.maxStatementDepth = 4;
  local_98.fragmentParameters.maxStatementsPerBlock = 7;
  local_98.fragmentParameters.maxExpressionDepth = 7;
  local_98.fragmentParameters.maxCombinedVariableScalars = 0x40;
  local_98.fragmentParameters.useTexture2D = true;
  local_98.fragmentParameters.useTextureCube = true;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  seed_00 = 0;
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pRVar2 = createRandomShaderCase
                       ((anon_unknown_1 *)pCVar1->m_testCtx,(Context *)pCVar1->m_renderCtx,
                        "Texture lookups in vertex shader",&local_98,seed_00,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar2);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pRVar2 = createRandomShaderCase
                       ((anon_unknown_1 *)pCVar1->m_testCtx,(Context *)pCVar1->m_renderCtx,
                        "Texture lookups in fragment shader",&local_98,seed_00,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar2);
    seed_00 = seed_00 + 1;
  } while (seed_00 != 100);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions		= true;
		params.useSwizzle				= true;
		params.useComparisonOps			= true;
		params.useConditionals			= true;
		params.trigonometricBaseWeight	= 1.0f;
		params.exponentialBaseWeight	= 1.0f;

		params.vertexParameters.maxStatementDepth				= 4;
		params.vertexParameters.maxStatementsPerBlock			= 7;
		params.vertexParameters.maxExpressionDepth				= 7;
		params.vertexParameters.maxCombinedVariableScalars		= 64;
		params.fragmentParameters.maxStatementDepth				= 4;
		params.fragmentParameters.maxStatementsPerBlock			= 7;
		params.fragmentParameters.maxExpressionDepth			= 7;
		params.fragmentParameters.maxCombinedVariableScalars	= 64;

		params.fragmentParameters.texLookupBaseWeight		= 4.0f; // \note Texture lookups are enabled for fragment shaders only.
		params.fragmentParameters.useTexture2D				= true;
		params.fragmentParameters.useTextureCube			= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Texture lookups in vertex shader",		params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Texture lookups in fragment shader",	params, seed, false, true));
		}
	}